

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char,capnp::Text::Reader>
          (StringTree *__return_storage_ptr__,kj *this,char *params,Reader *params_1)

{
  char *value;
  Reader *value_00;
  ArrayPtr<const_char> local_38;
  char local_21 [1];
  NoInfer<capnp::Text::Reader> *local_20;
  Reader *params_local_1;
  char *params_local;
  
  local_20 = (NoInfer<capnp::Text::Reader> *)params;
  params_local_1 = (Reader *)this;
  params_local = (char *)__return_storage_ptr__;
  value = fwd<char>((NoInfer<char> *)this);
  local_21[0] = (char)_::toStringTreeOrCharSequence<char>(value);
  value_00 = fwd<capnp::Text::Reader>(local_20);
  local_38 = _::toStringTreeOrCharSequence<capnp::Text::Reader>(value_00);
  StringTree::concat<kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)local_21,(FixedArray<char,_1UL> *)&local_38,
             (ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}